

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIExternalCommand::executeExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *job_context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  CancellationDelegate *pCVar1;
  _func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
  *p_Var2;
  _func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
  *p_Var3;
  llb_buildsystem_command_result_t result;
  undefined8 *puVar4;
  undefined8 *puVar5;
  CancellationDelegate *del;
  llb_build_value *plVar6;
  ScopeDefer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]swift_llbuild_products_libllbuild_BuildSystem_C_API_cpp:1117:7)>
  _defer_2;
  anon_class_80_5_b6e7d4dc local_80;
  
  local_80.ti.ctx = ti.ctx;
  local_80.ti.impl = ti.impl;
  local_80.this = this;
  local_80.system = system;
  local_80.job_context = job_context;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(&local_80.completionFn.Storage,&completionFn->Storage);
  if ((this->cAPIDelegate).execute_command_detached ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
       *)0x0) {
    p_Var2 = (this->cAPIDelegate).execute_command_ex;
    if (p_Var2 != (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      plVar6 = (*p_Var2)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                         (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                         (llb_buildsystem_queue_job_context_t *)job_context);
      this->currentBuildValue = (CAPIBuildValue *)plVar6;
      _defer_2.deferredWork.this =
           (anon_class_8_1_8991fb9c_for_deferredWork)(anon_class_8_1_8991fb9c_for_deferredWork)this;
      if (*(int *)plVar6 != 0) {
        executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()(&local_80,Succeeded);
        llbuild::basic::
        ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
        ::~ScopeDefer(&_defer_2);
        goto LAB_0016c32c;
      }
      llbuild::basic::
      ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
      ::~ScopeDefer(&_defer_2);
    }
    p_Var3 = (this->cAPIDelegate).execute_command;
    if (p_Var3 == (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      __assert_fail("cAPIDelegate.execute_command != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x46b,
                    "virtual void (anonymous namespace)::CAPIExternalCommand::executeExternalCommand(BuildSystem &, core::TaskInterface, QueueJobContext *, llvm::Optional<ProcessCompletionFn>)"
                   );
    }
    result = (*p_Var3)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                       (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                       (llb_buildsystem_queue_job_context_t *)job_context);
    executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()(&local_80,result);
  }
  else {
    puVar4 = (undefined8 *)operator_new(0x30);
    *puVar4 = this;
    puVar4[1] = system;
    puVar4[3] = 0;
    puVar5 = (undefined8 *)operator_new(0x50);
    *puVar5 = local_80.this;
    puVar5[1] = local_80.system;
    puVar5[2] = local_80.ti.impl;
    puVar5[3] = local_80.ti.ctx;
    puVar5[4] = local_80.job_context;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               (puVar5 + 5),&local_80.completionFn.Storage);
    puVar4[2] = puVar5;
    puVar4[5] = std::
                _Function_handler<void_(llbuild::basic::ProcessStatus),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1007:19)>
                ::_M_invoke;
    puVar4[4] = std::
                _Function_handler<void_(llbuild::basic::ProcessStatus),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1007:19)>
                ::_M_manager;
    (*(this->cAPIDelegate).execute_command_detached)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
               (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
               (llb_buildsystem_queue_job_context_t *)job_context,puVar4,
               executeExternalCommand::ResultCallbackContext::callback);
    if ((this->cAPIDelegate).cancel_detached_command !=
        (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
      del = (CancellationDelegate *)operator_new(0x10);
      del->_vptr_CancellationDelegate = (_func_int **)&PTR__CancellationDelegate_0022c210;
      del[1]._vptr_CancellationDelegate = (_func_int **)this;
      pCVar1 = (this->cancellationDelegate)._M_t.
               super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
               .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl;
      (this->cancellationDelegate)._M_t.
      super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
      .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl = del;
      if (pCVar1 != (CancellationDelegate *)0x0) {
        (*pCVar1->_vptr_CancellationDelegate[1])();
        del = (this->cancellationDelegate)._M_t.
              super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
              ._M_t.
              super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
              .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl;
      }
      llbuild::buildsystem::BuildSystem::addCancellationDelegate(system,del);
    }
  }
LAB_0016c32c:
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::reset(&local_80.completionFn.Storage);
  return;
}

Assistant:

virtual void executeExternalCommand(BuildSystem& system,
                                      core::TaskInterface ti,
                                      QueueJobContext* job_context,
                                      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto doneFn = [this, &system, ti, job_context, completionFn](ProcessStatus result) mutable {
      if (result != ProcessStatus::Succeeded) {
        // If the command did not succeed, there is no need to gather dependencies.
        if (completionFn.hasValue())
          completionFn.getValue()(result);
        return;
      }

      // Otherwise, collect the discovered dependencies, if used.
      bool dependencyParsingResult = false;
      if (!depsPaths.empty()) {
        for (const auto& depsPath: depsPaths) {
          switch (depsFormat) {
            case llb_buildsystem_dependency_data_format_unused:
              ti.delegate()->error("No dependency format specified for discovered dependency files.");
              dependencyParsingResult = false;
              break;
            case llb_buildsystem_dependency_data_format_makefile:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, false);
              break;
            case llb_buildsystem_dependency_data_format_dependencyinfo:
              dependencyParsingResult = processDependencyInfoDiscoveredDependencies(system, ti, job_context, depsPath);
              break;
            case llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, true);
              break;
          }
          
          if (!dependencyParsingResult) {
            // If we were unable to process the dependencies output, report a
            // failure.
            if (completionFn.hasValue())
              completionFn.getValue()(ProcessStatus::Failed);
            return;
          }
        }
      }

      if (completionFn.hasValue())
        completionFn.getValue()(result);
    };

    if (cAPIDelegate.execute_command_detached) {
      struct ResultCallbackContext {
        CAPIExternalCommand *thisCommand;
        BuildSystem *buildSystem;
        std::function<void(ProcessStatus result)> doneFn;

        static void callback(void* result_ctx,
                             llb_buildsystem_command_result_t result,
                             llb_build_value* rvalue) {
          ResultCallbackContext *ctx = static_cast<ResultCallbackContext*>(result_ctx);
          auto thisCommand = ctx->thisCommand;
          BuildSystem &system = *ctx->buildSystem;
          auto doneFn = std::move(ctx->doneFn);
          delete ctx;

          thisCommand->detachedCommandFinished = true;
          if (auto cancellationDelegate = thisCommand->cancellationDelegate.get()) {
            system.removeCancellationDelegate(cancellationDelegate);
            thisCommand->cancellationDelegate = nullptr;
          }

          thisCommand->currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
          llbuild_defer {
            delete thisCommand->currentBuildValue;
            thisCommand->currentBuildValue = nullptr;
          };
          doneFn(getProcessStatusFromLLBResult(result));
        }
      };
      auto *callbackCtx = new ResultCallbackContext{this, &system, std::move(doneFn)};
      cAPIDelegate.execute_command_detached(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context,
        callbackCtx, ResultCallbackContext::callback);

      if (cAPIDelegate.cancel_detached_command) {
        class CAPICancellationDelegate: public core::CancellationDelegate {
          CAPIExternalCommand *thisCommand;

        public:
          CAPICancellationDelegate(CAPIExternalCommand *thisCommand) : thisCommand(thisCommand) {}

          void buildCancelled() override {
            if (thisCommand->detachedCommandFinished)
              return;
            thisCommand->cAPIDelegate.cancel_detached_command(
              thisCommand->cAPIDelegate.context,
              (llb_buildsystem_command_t*)this);
          }
        };
        this->cancellationDelegate = std::make_unique<CAPICancellationDelegate>(this);
        system.addCancellationDelegate(this->cancellationDelegate.get());
      }
      return;
    }

    if (cAPIDelegate.execute_command_ex) {
      llb_build_value* rvalue = cAPIDelegate.execute_command_ex(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context);

      currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
      llbuild_defer {
        delete currentBuildValue;
        currentBuildValue = nullptr;
      };

      if (!currentBuildValue->getInternalBuildValue().isInvalid()) {
        doneFn(ProcessStatus::Succeeded);
        return;
      }

      // An invalid value is interpreted as an unsupported method call and falls
      // through to execute_command below.
    }